

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
duckdb::SampleOptions::Deserialize(Deserializer *deserializer)

{
  byte bVar1;
  SampleMethod SVar2;
  pointer pSVar3;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> in_RDI;
  long seed;
  SampleMethod method;
  bool is_percentage;
  Value sample_size;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *result;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Value *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  Deserializer *in_stack_ffffffffffffff50;
  Deserializer *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff68;
  field_id_t in_stack_ffffffffffffff76;
  int64_t in_stack_ffffffffffffffc8;
  SampleOptions *in_stack_ffffffffffffffd0;
  
  Deserializer::ReadProperty<duckdb::Value>
            ((Deserializer *)
             in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
             .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl,
             in_stack_ffffffffffffff76,in_stack_ffffffffffffff68);
  bVar1 = Deserializer::ReadPropertyWithDefault<bool>
                    (in_stack_ffffffffffffff58,
                     (field_id_t)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                     (char *)CONCAT17(in_stack_ffffffffffffff4f,
                                      CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48))
                    );
  SVar2 = Deserializer::ReadProperty<duckdb::SampleMethod>
                    (in_stack_ffffffffffffff50,
                     CONCAT11(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff4e),
                     (char *)in_stack_ffffffffffffff40);
  Deserializer::ReadPropertyWithDefault<long>
            (in_stack_ffffffffffffff58,(field_id_t)((ulong)in_stack_ffffffffffffff50 >> 0x30),
             (char *)CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
  operator_new(0x58);
  SampleOptions(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>::
  unique_ptr<std::default_delete<duckdb::SampleOptions>,void>
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             in_stack_ffffffffffffff40,
             (pointer)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::operator->
            ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *)
             in_stack_ffffffffffffff40);
  Value::operator=((Value *)CONCAT17(in_stack_ffffffffffffff4f,
                                     CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)),
                   in_stack_ffffffffffffff40);
  pSVar3 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)in_stack_ffffffffffffff40);
  pSVar3->is_percentage = (bool)(bVar1 & 1);
  pSVar3 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)in_stack_ffffffffffffff40);
  pSVar3->method = SVar2;
  Value::~Value(&pSVar3->sample_size);
  return (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
         (__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
         .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SampleOptions> SampleOptions::Deserialize(Deserializer &deserializer) {
	auto sample_size = deserializer.ReadProperty<Value>(100, "sample_size");
	auto is_percentage = deserializer.ReadPropertyWithDefault<bool>(101, "is_percentage");
	auto method = deserializer.ReadProperty<SampleMethod>(102, "method");
	auto seed = deserializer.ReadPropertyWithDefault<int64_t>(103, "seed");
	auto result = duckdb::unique_ptr<SampleOptions>(new SampleOptions(seed));
	result->sample_size = sample_size;
	result->is_percentage = is_percentage;
	result->method = method;
	return result;
}